

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_hierarchy_visualize.hpp
# Opt level: O2

void visualize(SphereTree *tree)

{
  pointer pSVar1;
  pointer pSVar2;
  initializer_list<SphereTree> __l;
  vec3f camerapos;
  int local_150;
  allocator local_149;
  vector<SphereTree,_std::allocator<SphereTree>_> layer;
  SphereTree t;
  vector<Sphere,_std::allocator<Sphere>_> spheres;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Vector_base<Sphere,_std::allocator<Sphere>_> local_c8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  SphereTree::SphereTree(&t,tree);
  __l._M_len = 1;
  __l._M_array = &t;
  std::vector<SphereTree,_std::allocator<SphereTree>_>::vector
            (&layer,__l,(allocator_type *)&local_e8);
  std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&t.child);
  local_150 = 0;
  while( true ) {
    pSVar1 = layer.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (layer.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
        super__Vector_impl_data._M_start ==
        layer.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    for (pSVar2 = layer.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                  super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
      SphereTree::SphereTree(&t,pSVar2);
      std::vector<Sphere,_std::allocator<Sphere>_>::push_back
                ((vector<Sphere,_std::allocator<Sphere>_> *)
                 &spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>,&t.bound);
      std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&t.child);
    }
    std::vector<Sphere,_std::allocator<Sphere>_>::vector
              ((vector<Sphere,_std::allocator<Sphere>_> *)&local_c8,
               (vector<Sphere,_std::allocator<Sphere>_> *)
               &spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>);
    std::__cxx11::string::string((string *)&local_e8,"hierarchy/",&local_149);
    std::__cxx11::to_string(&local_90,local_150);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t,&local_e8
                   ,&local_90);
    std::operator+(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t
                   ,".json");
    std::__cxx11::to_string(&local_b0,local_150);
    std::operator+(&local_50,&local_b0,".png");
    camerapos.z = -5.76543;
    camerapos.x = 3.0;
    camerapos.y = 2.0;
    visualize((vector<Sphere,_std::allocator<Sphere>_> *)&local_c8,&local_70,&local_50,camerapos);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&t);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_e8);
    std::_Vector_base<Sphere,_std::allocator<Sphere>_>::~_Vector_base(&local_c8);
    nextlayer((vector<SphereTree,_std::allocator<SphereTree>_> *)&t,&layer);
    std::vector<SphereTree,_std::allocator<SphereTree>_>::_M_move_assign(&layer,&t);
    std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector
              ((vector<SphereTree,_std::allocator<SphereTree>_> *)&t);
    std::_Vector_base<Sphere,_std::allocator<Sphere>_>::~_Vector_base
              (&spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>);
    local_150 = local_150 + 1;
  }
  std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&layer);
  return;
}

Assistant:

void visualize(SphereTree tree)
{
	std::vector<SphereTree> layer = {tree};
	for (int id=0; !layer.empty(); ++id) {
		std::vector<Sphere> spheres;
		for (auto t: layer)
			spheres.push_back(t.bound);
		visualize(spheres, std::string("hierarchy/") + std::to_string(id) + ".json", std::to_string(id) + ".png");
		layer = nextlayer(layer);
	}
}